

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_append(roaring_array_t *ra,uint16_t key,container_t *c,uint8_t typecode)

{
  int iVar1;
  undefined1 in_CL;
  roaring_array_t *in_RDX;
  undefined2 in_SI;
  int *in_RDI;
  int32_t pos;
  undefined3 in_stack_ffffffffffffffe4;
  int32_t k;
  
  k = CONCAT13(in_CL,in_stack_ffffffffffffffe4);
  extend_array(in_RDX,k);
  iVar1 = *in_RDI;
  *(undefined2 *)(*(long *)(in_RDI + 4) + (long)iVar1 * 2) = in_SI;
  *(roaring_array_t **)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) = in_RDX;
  *(char *)(*(long *)(in_RDI + 6) + (long)iVar1) = (char)((uint)k >> 0x18);
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void ra_append(roaring_array_t *ra, uint16_t key, container_t *c,
               uint8_t typecode) {
    extend_array(ra, 1);
    const int32_t pos = ra->size;

    ra->keys[pos] = key;
    ra->containers[pos] = c;
    ra->typecodes[pos] = typecode;
    ra->size++;
}